

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void close_state(lua_State *L)

{
  byte bVar1;
  uint32_t uVar2;
  undefined4 uVar3;
  GCRef *pGVar4;
  int iVar5;
  uint uVar6;
  global_State *g_00;
  size_t sVar7;
  long in_RDI;
  MSize segnum;
  global_State *g;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  void *in_stack_ffffffffffffff90;
  TValue *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  
  g_00 = (global_State *)(ulong)*(uint *)(in_RDI + 8);
  lj_func_closeuv(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  lj_gc_freeall(g_00);
  lj_trace_freestate(g_00);
  lj_ctype_freestate((global_State *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  pGVar4 = g_00->strhash;
  sVar7 = (ulong)(g_00->strmask + 1) * 4;
  (g_00->gc).total = (g_00->gc).total - (int)sVar7;
  (g_00->gc).freed = sVar7 + (g_00->gc).freed;
  (*g_00->allocf)(g_00->allocd,pGVar4,sVar7,0);
  uVar2 = (g_00->tmpbuf).b.ptr32;
  uVar6 = (g_00->tmpbuf).e.ptr32 - (g_00->tmpbuf).b.ptr32;
  (g_00->gc).total = (g_00->gc).total - uVar6;
  (g_00->gc).freed = (ulong)uVar6 + (g_00->gc).freed;
  (*g_00->allocf)(g_00->allocd,(void *)uVar2,(ulong)uVar6,0);
  uVar3 = *(undefined4 *)(in_RDI + 0x24);
  sVar7 = (ulong)*(uint *)(in_RDI + 0x38) * 8;
  (g_00->gc).total = (g_00->gc).total - (int)sVar7;
  (g_00->gc).freed = sVar7 + (g_00->gc).freed;
  (*g_00->allocf)(g_00->allocd,(void *)uVar3,sVar7,0);
  if ((g_00->gc).lightudseg.ptr32 != 0) {
    if ((g_00->gc).lightudnum == '\0') {
      uVar6 = 2;
    }
    else {
      bVar1 = (g_00->gc).lightudnum;
      iVar5 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar5 == 0; iVar5 = iVar5 + -1) {
        }
      }
      uVar6 = 2 << ((byte)iVar5 & 0x1f);
    }
    uVar2 = (g_00->gc).lightudseg.ptr32;
    in_stack_ffffffffffffff90 = (void *)((ulong)uVar6 * 4);
    (g_00->gc).total = (g_00->gc).total - (int)in_stack_ffffffffffffff90;
    (g_00->gc).freed = (long)in_stack_ffffffffffffff90 + (g_00->gc).freed;
    (*g_00->allocf)(g_00->allocd,(void *)uVar2,(size_t)in_stack_ffffffffffffff90,0);
  }
  if (g_00->allocf == lj_alloc_f) {
    lj_alloc_destroy(in_stack_ffffffffffffff90);
  }
  else {
    (*g_00->allocf)(g_00->allocd,g_00[-1].gcroot + 0x1c,0x15a8,0);
  }
  return;
}

Assistant:

static void close_state(lua_State *L)
{
  global_State *g = G(L);
  lj_func_closeuv(L, tvref(L->stack));
  lj_gc_freeall(g);
  lj_assertG(gcref(g->gc.root) == obj2gco(L),
	     "main thread is not first GC object");
  lj_assertG(g->strnum == 0, "leaked %d strings", g->strnum);
  lj_trace_freestate(g);
#if LJ_HASFFI
  lj_ctype_freestate(g);
#endif
  lj_mem_freevec(g, g->strhash, g->strmask+1, GCRef);
  lj_buf_free(g, &g->tmpbuf);
  lj_mem_freevec(g, tvref(L->stack), L->stacksize, TValue);
#if LJ_64
  if (mref(g->gc.lightudseg, uint32_t)) {
    MSize segnum = g->gc.lightudnum ? (2 << lj_fls(g->gc.lightudnum)) : 2;
    lj_mem_freevec(g, mref(g->gc.lightudseg, uint32_t), segnum, uint32_t);
  }
#endif
  lj_assertG(g->gc.total == sizeof(GG_State),
	     "memory leak of %lld bytes",
	     (long long)(g->gc.total - sizeof(GG_State)));
#ifndef LUAJIT_USE_SYSMALLOC
  if (g->allocf == lj_alloc_f)
    lj_alloc_destroy(g->allocd);
  else
#endif
    g->allocf(g->allocd, G2GG(g), sizeof(GG_State), 0);
}